

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_MAC_Poly1305_Simd256.c
# Opt level: O1

void Hacl_MAC_Poly1305_Simd256_free(Hacl_MAC_Poly1305_Simd256_state_t *state)

{
  Lib_IntVector_Intrinsics_vec256 *__ptr;
  uint8_t *__ptr_00;
  
  __ptr = state->block_state;
  __ptr_00 = state->buf;
  free(state->p_key);
  free(__ptr);
  free(__ptr_00);
  free(state);
  return;
}

Assistant:

void Hacl_MAC_Poly1305_Simd256_free(Hacl_MAC_Poly1305_Simd256_state_t *state)
{
  Hacl_MAC_Poly1305_Simd256_state_t scrut = *state;
  uint8_t *k_ = scrut.p_key;
  uint8_t *buf = scrut.buf;
  Lib_IntVector_Intrinsics_vec256 *block_state = scrut.block_state;
  KRML_HOST_FREE(k_);
  KRML_ALIGNED_FREE(block_state);
  KRML_HOST_FREE(buf);
  KRML_HOST_FREE(state);
}